

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O0

CameraParameters * polyscope::view::getCameraParametersForCurrentView(void)

{
  CameraParameters *in_RDI;
  ulong in_XMM0_Qa;
  undefined1 auVar2 [56];
  undefined1 auVar1 [64];
  CameraIntrinsics CVar3;
  double aspectRatio;
  CameraParameters *this;
  float *in_stack_ffffffffffffff88;
  float *in_stack_ffffffffffffff90;
  
  this = in_RDI;
  ensureViewValid();
  auVar2 = ZEXT856(in_XMM0_Qa);
  CVar3 = CameraIntrinsics::fromFoVDegVerticalAndAspect
                    (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  auVar1._0_8_ = CVar3._0_8_;
  auVar1._8_56_ = auVar2;
  vmovlpd_avx(auVar1._0_16_);
  CameraExtrinsics::fromMatrix((mat4 *)this);
  CameraParameters::CameraParameters(this,&in_RDI->intrinsics,(CameraExtrinsics *)0x3dd683);
  return this;
}

Assistant:

CameraParameters getCameraParametersForCurrentView() {
  ensureViewValid();

  double aspectRatio = (float)bufferWidth / bufferHeight;
  return CameraParameters(CameraIntrinsics::fromFoVDegVerticalAndAspect(fov, aspectRatio),
                          CameraExtrinsics::fromMatrix(viewMat));
}